

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall TArray<WadStuff,_WadStuff>::Resize(TArray<WadStuff,_WadStuff> *this,uint amount)

{
  uint uVar1;
  uint amount_00;
  long lVar2;
  int *piVar3;
  
  uVar1 = this->Count;
  amount_00 = amount - uVar1;
  if (amount < uVar1 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar1 - 1);
    }
  }
  else {
    Grow(this,amount_00);
    uVar1 = this->Count;
    if (uVar1 < amount) {
      piVar3 = &this->Array[uVar1].Type;
      lVar2 = (ulong)amount - (ulong)uVar1;
      do {
        (((WadStuff *)(piVar3 + -4))->Path).Chars = (char *)0x723dac;
        ((FString *)(piVar3 + -2))->Chars = (char *)0x723dac;
        *piVar3 = 0;
        piVar3 = piVar3 + 6;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      FString::NullString.RefCount = FString::NullString.RefCount + amount * 2 + uVar1 * -2;
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}